

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

void __thiscall
cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::Matcher
          (Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits> *this,string_ref query,
          MatcherOptions *opts)

{
  string_ref str;
  string_ref str_00;
  undefined1 uVar1;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> first;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> _Var2;
  iterator_type iVar3;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  MatchInfo *in_RDI;
  vector<char32_t,_std::allocator<char32_t>_> *in_stack_fffffffffffffec8;
  MatchInfo *pMVar4;
  _func_bool_char32_t *in_stack_fffffffffffffed0;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  in_stack_fffffffffffffed8;
  vector<char32_t,_std::allocator<char32_t>_> *this_00;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  in_stack_fffffffffffffee0;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  in_stack_fffffffffffffef0;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  in_stack_fffffffffffffef8;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> first_00;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  size_t in_stack_ffffffffffffff08;
  MatchInfo *__first;
  Iterator last;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  local_a0 [2];
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  local_90;
  char32_t *local_88;
  char32_t *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  char32_t *local_68;
  char32_t *local_60;
  char32_t *local_58;
  char32_t *local_50;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 *local_20;
  undefined8 local_10;
  undefined8 uStack_8;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  MatchInfo::MatchInfo(in_RDI);
  in_RDI->_vptr_MatchInfo = (_func_int **)&PTR__Matcher_00162d18;
  std::vector<char32_t,_std::allocator<char32_t>_>::vector
            ((vector<char32_t,_std::allocator<char32_t>_> *)0x14c596);
  __gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  ::__normal_iterator((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                       *)(in_RDI + 4));
  std::
  vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
  ::vector((vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
            *)0x14c5b7);
  __gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  ::__normal_iterator((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                       *)(in_RDI + 8));
  std::
  vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  ::vector((vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
            *)0x14c5d8);
  local_38 = local_10;
  uStack_30 = uStack_8;
  str.ptr_._7_1_ = in_stack_ffffffffffffff07;
  str.ptr_._0_7_ = in_stack_ffffffffffffff00;
  str.len_ = in_stack_ffffffffffffff08;
  decode<cpsm::Utf8StringTraits>(str);
  __first = in_RDI + 0x16;
  last._M_current = (char32_t *)(in_RDI + 0x13);
  local_50 = (char32_t *)
             std::vector<char32_t,_std::allocator<char32_t>_>::cbegin(in_stack_fffffffffffffec8);
  local_58 = (char32_t *)
             std::vector<char32_t,_std::allocator<char32_t>_>::cend(in_stack_fffffffffffffec8);
  first = path_basename<cpsm::NonPathTraits,__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>
                    (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  __first->_vptr_MatchInfo = (_func_int **)first._M_current;
  _Var2._M_current = (char32_t *)(in_RDI + 0x17);
  first_00._M_current = (char32_t *)(in_RDI + 0x13);
  local_60 = (char32_t *)
             std::vector<char32_t,_std::allocator<char32_t>_>::cbegin(in_stack_fffffffffffffec8);
  local_68 = (char32_t *)
             std::vector<char32_t,_std::allocator<char32_t>_>::cend(in_stack_fffffffffffffec8);
  uVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,bool(*)(char32_t)>
                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  *(undefined1 *)&((MatchInfo *)_Var2._M_current)->_vptr_MatchInfo = uVar1;
  local_78 = *local_20;
  uStack_70 = local_20[1];
  str_00.ptr_._7_1_ = (bool)uVar1;
  str_00.ptr_._0_7_ = in_stack_ffffffffffffff00;
  str_00.len_ = (size_t)__first;
  decode<cpsm::Utf8StringTraits>(str_00);
  pMVar4 = in_RDI + 0x1b;
  this_00 = (vector<char32_t,_std::allocator<char32_t>_> *)(in_RDI + 0x18);
  local_80 = (char32_t *)
             std::vector<char32_t,_std::allocator<char32_t>_>::cbegin(in_stack_fffffffffffffec8);
  local_88 = (char32_t *)
             std::vector<char32_t,_std::allocator<char32_t>_>::cend(in_stack_fffffffffffffec8);
  _Var2 = path_basename<cpsm::NonPathTraits,__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>
                    (first_00,_Var2);
  pMVar4->_vptr_MatchInfo = (_func_int **)_Var2._M_current;
  pMVar4 = in_RDI + 0x1c;
  std::vector<char32_t,_std::allocator<char32_t>_>::crbegin(this_00);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  ::reverse_iterator(local_a0,(iterator_type)in_RDI[0x1b]._vptr_MatchInfo);
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>,bool(*)(char)>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
              *)__first,
             (reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
              *)CONCAT17(uVar1,in_stack_ffffffffffffff00),(_func_bool_char *)first_00._M_current);
  iVar3 = std::
          reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
          ::base(&local_90);
  pMVar4->_vptr_MatchInfo = (_func_int **)iVar3._M_current;
  find_word_endings((Iterator)first._M_current,last);
  *(byte *)&in_RDI[0x20]._vptr_MatchInfo = *(byte *)(local_20 + 2) & 1;
  return;
}

Assistant:

explicit Matcher(boost::string_ref const query, MatcherOptions const& opts)
      // Queries are smartcased (case-sensitive only if any uppercase appears
      // in the query).
      : query_(decode<StringTraits>(query)),
        query_basename_(path_basename<PathTraits>(query_.cbegin(),
                                                  query_.cend())),
        case_sensitive_(std::any_of(query_.cbegin(), query_.cend(),
                                    StringTraits::is_uppercase)),
        crfile_(decode<StringTraits>(opts.crfile)),
        crfile_basename_(path_basename<PathTraits>(crfile_.cbegin(),
                                                   crfile_.cend())),
        crfile_ext_(std::find_if(crfile_.crbegin(),
                                 ReverseIterator(crfile_basename_),
                                 PathTraits::is_extension_separator).base()),
        crfile_basename_word_ends_(find_word_endings(crfile_basename_,
                                                     crfile_ext_)),
        match_crfile_(opts.match_crfile) {}